

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

void __thiscall GraphBuilder::~GraphBuilder(GraphBuilder *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->artificialNodes_)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if (p_Var1[1]._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[1]._M_nxt)();
    }
  }
  for (p_Var1 = (this->llvmToNodeMap_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0
      ; p_Var1 = p_Var1->_M_nxt) {
    if (p_Var1[2]._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)(p_Var1[2]._M_nxt)->_M_nxt[1]._M_nxt)();
    }
  }
  for (p_Var1 = (this->llvmToBlockMap_)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if (p_Var1[2]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(p_Var1[2]._M_nxt,0x18);
    }
  }
  for (p_Var1 = (this->llvmToFunctionMap_)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if (p_Var1[2]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(p_Var1[2]._M_nxt,0x18);
    }
  }
  std::
  _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToUnlocks_)._M_h);
  std::
  _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_LockNode_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToLocks_)._M_h);
  std::
  _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_ForkNode_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_ForkNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToForks_)._M_h);
  std::
  _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToJoins_)._M_h);
  std::
  _Hashtable<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToFunctionMap_)._M_h);
  std::
  _Hashtable<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToBlockMap_)._M_h);
  std::
  _Hashtable<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_Node_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Instruction_*>,_std::hash<const_llvm::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->llvmToNodeMap_)._M_h);
  std::
  _Hashtable<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->artificialNodes_)._M_h);
  return;
}

Assistant:

GraphBuilder::~GraphBuilder() {
    for (auto *node : artificialNodes_) {
        delete node;
    }

    for (auto llvmAndNode : llvmToNodeMap_) {
        delete llvmAndNode.second;
    }

    for (auto iterator : llvmToBlockMap_) {
        delete iterator.second;
    }

    for (auto iterator : llvmToFunctionMap_) {
        delete iterator.second;
    }
}